

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall SmallArray<InplaceStr,_8U>::grow(SmallArray<InplaceStr,_8U> *this,uint newSize)

{
  InplaceStr *pIVar1;
  uint local_24;
  InplaceStr *pIStack_20;
  uint i;
  InplaceStr *newData;
  uint newSize_local;
  SmallArray<InplaceStr,_8U> *this_local;
  
  if (newSize < this->max + (this->max >> 1)) {
    newData._4_4_ = this->max + (this->max >> 1);
  }
  else {
    newData._4_4_ = newSize + 4;
  }
  if (this->allocator == (Allocator *)0x0) {
    pIStack_20 = NULLC::construct<InplaceStr>(newData._4_4_);
  }
  else {
    pIStack_20 = Allocator::construct<InplaceStr>(this->allocator,newData._4_4_);
  }
  for (local_24 = 0; local_24 < this->count; local_24 = local_24 + 1) {
    pIVar1 = this->data;
    pIStack_20[local_24].begin = pIVar1[local_24].begin;
    pIStack_20[local_24].end = pIVar1[local_24].end;
  }
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<InplaceStr>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<InplaceStr>(this->allocator,this->data,(ulong)this->max);
    }
  }
  this->data = pIStack_20;
  this->max = newData._4_4_;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}